

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::AppendSection(cmDocumentation *this,char *name,char *(*docs) [2])

{
  char *(*papcVar1) [2];
  bool bVar2;
  cmDocumentationSection *this_00;
  char *pcVar3;
  mapped_type *ppcVar4;
  allocator local_d9;
  key_type local_d8;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  _Self local_70 [3];
  allocator local_51;
  key_type local_50;
  _Self local_30;
  cmDocumentationSection *local_28;
  cmDocumentationSection *sec;
  char *(*docs_local) [2];
  char *name_local;
  cmDocumentation *this_local;
  
  local_28 = (cmDocumentationSection *)0x0;
  sec = (cmDocumentationSection *)docs;
  docs_local = (char *(*) [2])name;
  name_local = &this->ShowGenerators;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
       ::find(&this->AllSections,&local_50);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
       ::end(&this->AllSections);
  bVar2 = std::operator==(&local_30,local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  papcVar1 = docs_local;
  if (bVar2) {
    this_00 = (cmDocumentationSection *)operator_new(0x38);
    papcVar1 = docs_local;
    local_b2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,(char *)papcVar1,&local_b1);
    cmsys::SystemTools::UpperCase(&local_90,&local_b0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmDocumentationSection::cmDocumentationSection(this_00,(char *)papcVar1,pcVar3);
    local_b2 = 0;
    local_28 = this_00;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    SetSection(this,(char *)docs_local,local_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,(char *)papcVar1,&local_d9);
    ppcVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
              ::operator[](&this->AllSections,&local_d8);
    local_28 = *ppcVar4;
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  cmDocumentationSection::Append(local_28,(char *(*) [2])sec);
  return;
}

Assistant:

void cmDocumentation::AppendSection(const char* name, const char* docs[][2])
{
  cmDocumentationSection* sec = CM_NULLPTR;
  if (this->AllSections.find(name) == this->AllSections.end()) {
    sec =
      new cmDocumentationSection(name, cmSystemTools::UpperCase(name).c_str());
    this->SetSection(name, sec);
  } else {
    sec = this->AllSections[name];
  }
  sec->Append(docs);
}